

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

string * BayesianGameWithClusterInfo::SoftPrint_abi_cxx11_(BGClusterAlgorithm clusterAlg)

{
  char *__s;
  undefined8 uVar1;
  uint in_ESI;
  E *in_RDI;
  E *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_d [13];
  
  __s = (char *)(ulong)in_ESI;
  switch(__s) {
  case (char *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_d);
    break;
  case (char *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
    break;
  case (char *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
    break;
  case (char *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe1);
    break;
  default:
    this = in_RDI;
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(this,(char *)in_RDI);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  return (string *)in_RDI;
}

Assistant:

string BayesianGameWithClusterInfo::SoftPrint(BGClusterAlgorithm clusterAlg)
{
    switch(clusterAlg)
    {
    case Lossless:
        return("Lossless");
    case ApproxJB:
        return("ApproxJB");
    case ApproxPjaoh:
        return("ApproxPjaoh");
    case ApproxPjaohJB:
        return("ApproxPjaohJB");
    }

    throw(E("BayesianGameWithClusterInfo::SoftPrint BGClusterAlgorithm not handled"));
    return("");
}